

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_test.cpp
# Opt level: O2

void __thiscall Filter_ZeroPastRadius_Test::TestBody(Filter_ZeroPastRadius_Test *this)

{
  undefined8 uVar1;
  Tuple2<pbrt::Vector2,_float> TVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  pointer pFVar7;
  Tuple2<pbrt::Vector2,_float> *pTVar8;
  GaussianFilter *this_00;
  Allocator AVar9;
  MitchellFilter *this_01;
  LanczosSincFilter *this_02;
  pointer pFVar10;
  long lVar11;
  anon_class_8_1_54a39810 eval;
  char *pcVar12;
  undefined1 auVar13 [16];
  initializer_list<pbrt::FilterHandle> __l;
  undefined8 local_d8;
  Float local_cc;
  AssertHelper local_c8;
  Vector2f r;
  AssertionResult gtest_ar;
  FilterHandle f;
  _Vector_base<pbrt::FilterHandle,_std::allocator<pbrt::FilterHandle>_> local_70;
  Tuple2<pbrt::Vector2,_float> local_58 [5];
  
  auVar13._8_4_ = 0x40400000;
  auVar13._0_8_ = 0x4040000040400000;
  auVar13._12_4_ = 0x40400000;
  lVar11 = 0;
  local_58[0].x = 1.0;
  local_58[0].y = 1.0;
  local_58[1].x = 1.5;
  local_58[1].y = 0.25;
  local_58[2].x = 0.33;
  local_58[2].y = 5.2;
  local_58[3].x = 0.1;
  local_58[3].y = 0.1;
  uVar1 = vmovlps_avx(auVar13);
  local_58[4].x = (float)(int)uVar1;
  local_58[4].y = (float)(int)((ulong)uVar1 >> 0x20);
  for (; lVar11 != 0x28; lVar11 = lVar11 + 8) {
    TVar2 = *(Tuple2<pbrt::Vector2,_float> *)((long)&local_58[0].x + lVar11);
    r.super_Tuple2<pbrt::Vector2,_float> = TVar2;
    pTVar8 = (Tuple2<pbrt::Vector2,_float> *)operator_new(8);
    *pTVar8 = TVar2;
    gtest_ar._0_8_ = (ulong)pTVar8 | 0x1000000000000;
    this_00 = (GaussianFilter *)operator_new(200);
    AVar9.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::GaussianFilter::GaussianFilter(this_00,&r,0.5,AVar9);
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((ulong)this_00 | 0x2000000000000);
    this_01 = (MitchellFilter *)operator_new(0xc0);
    AVar9.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::MitchellFilter::MitchellFilter(this_01,&r,0.33333334,0.33333334,AVar9);
    this_02 = (LanczosSincFilter *)operator_new(0xc0);
    AVar9.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::LanczosSincFilter::LanczosSincFilter(this_02,&r,3.0,AVar9);
    pTVar8 = (Tuple2<pbrt::Vector2,_float> *)operator_new(8);
    *pTVar8 = r.super_Tuple2<pbrt::Vector2,_float>;
    __l._M_len = 5;
    __l._M_array = (iterator)&gtest_ar;
    std::vector<pbrt::FilterHandle,_std::allocator<pbrt::FilterHandle>_>::vector
              ((vector<pbrt::FilterHandle,_std::allocator<pbrt::FilterHandle>_> *)&local_70,__l,
               (allocator_type *)&f);
    pFVar7 = local_70._M_impl.super__Vector_impl_data._M_finish;
    for (pFVar10 = local_70._M_impl.super__Vector_impl_data._M_start; pFVar10 != pFVar7;
        pFVar10 = pFVar10 + 1) {
      f.
      super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
      .bits = (TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
               )(pFVar10->
                super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
                ).bits;
      local_c8.data_._0_4_ = 0;
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = r.super_Tuple2<pbrt::Vector2,_float>.y + 0.001;
      local_cc = pbrt::
                 TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                 ::
                 Dispatch<pbrt::FilterHandle::Evaluate(pbrt::Point2<float>const&)const::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                             *)&f,(Point2f *)&local_d8);
      testing::internal::CmpHelperEQ<int,float>
                ((internal *)&gtest_ar,"0","f.Evaluate(Point2f(0, r.y + 1e-3))",(int *)&local_c8,
                 &local_cc);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_d8);
        pcVar12 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/filters_test.cpp"
                   ,0x2f,pcVar12);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_d8);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_c8.data_._0_4_ = 0;
      local_d8._4_4_ = r.super_Tuple2<pbrt::Vector2,_float>.y + 0.001;
      local_d8._0_4_ = r.super_Tuple2<pbrt::Vector2,_float>.x;
      local_cc = pbrt::
                 TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                 ::
                 Dispatch<pbrt::FilterHandle::Evaluate(pbrt::Point2<float>const&)const::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                             *)&f,(Point2f *)&local_d8);
      testing::internal::CmpHelperEQ<int,float>
                ((internal *)&gtest_ar,"0","f.Evaluate(Point2f(r.x, r.y + 1e-3))",(int *)&local_c8,
                 &local_cc);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_d8);
        pcVar12 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/filters_test.cpp"
                   ,0x30,pcVar12);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_d8);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_c8.data_._0_4_ = 0;
      auVar3._8_4_ = 0x80000000;
      auVar3._0_8_ = 0x8000000080000000;
      auVar3._12_4_ = 0x80000000;
      auVar13 = vxorps_avx512vl(ZEXT416((uint)r.super_Tuple2<pbrt::Vector2,_float>.x),auVar3);
      local_d8._4_4_ = r.super_Tuple2<pbrt::Vector2,_float>.y + 0.001;
      local_d8._0_4_ = auVar13._0_4_;
      local_cc = pbrt::
                 TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                 ::
                 Dispatch<pbrt::FilterHandle::Evaluate(pbrt::Point2<float>const&)const::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                             *)&f,(Point2f *)&local_d8);
      testing::internal::CmpHelperEQ<int,float>
                ((internal *)&gtest_ar,"0","f.Evaluate(Point2f(-r.x, r.y + 1e-3))",(int *)&local_c8,
                 &local_cc);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_d8);
        pcVar12 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/filters_test.cpp"
                   ,0x31,pcVar12);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_d8);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_c8.data_._0_4_ = 0;
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = -0.001 - r.super_Tuple2<pbrt::Vector2,_float>.y;
      local_cc = pbrt::
                 TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                 ::
                 Dispatch<pbrt::FilterHandle::Evaluate(pbrt::Point2<float>const&)const::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                             *)&f,(Point2f *)&local_d8);
      testing::internal::CmpHelperEQ<int,float>
                ((internal *)&gtest_ar,"0","f.Evaluate(Point2f(0, -r.y - 1e-3))",(int *)&local_c8,
                 &local_cc);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_d8);
        pcVar12 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/filters_test.cpp"
                   ,0x32,pcVar12);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_d8);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_c8.data_._0_4_ = 0;
      local_d8._0_4_ = r.super_Tuple2<pbrt::Vector2,_float>.x;
      local_d8._4_4_ = -0.001 - r.super_Tuple2<pbrt::Vector2,_float>.y;
      local_cc = pbrt::
                 TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                 ::
                 Dispatch<pbrt::FilterHandle::Evaluate(pbrt::Point2<float>const&)const::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                             *)&f,(Point2f *)&local_d8);
      testing::internal::CmpHelperEQ<int,float>
                ((internal *)&gtest_ar,"0","f.Evaluate(Point2f(r.x, -r.y - 1e-3))",(int *)&local_c8,
                 &local_cc);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_d8);
        pcVar12 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/filters_test.cpp"
                   ,0x33,pcVar12);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_d8);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_c8.data_._0_4_ = 0;
      auVar4._8_4_ = 0x80000000;
      auVar4._0_8_ = 0x8000000080000000;
      auVar4._12_4_ = 0x80000000;
      auVar13 = vxorps_avx512vl(ZEXT416((uint)r.super_Tuple2<pbrt::Vector2,_float>.x),auVar4);
      local_d8._0_4_ = auVar13._0_4_;
      local_d8._4_4_ = -0.001 - r.super_Tuple2<pbrt::Vector2,_float>.y;
      local_cc = pbrt::
                 TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                 ::
                 Dispatch<pbrt::FilterHandle::Evaluate(pbrt::Point2<float>const&)const::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                             *)&f,(Point2f *)&local_d8);
      testing::internal::CmpHelperEQ<int,float>
                ((internal *)&gtest_ar,"0","f.Evaluate(Point2f(-r.x, -r.y - 1e-3))",(int *)&local_c8
                 ,&local_cc);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_d8);
        pcVar12 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/filters_test.cpp"
                   ,0x34,pcVar12);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_d8);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_c8.data_._0_4_ = 0;
      local_d8._0_4_ = r.super_Tuple2<pbrt::Vector2,_float>.x + 0.001;
      local_d8._4_4_ = 0.0;
      local_cc = pbrt::
                 TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                 ::
                 Dispatch<pbrt::FilterHandle::Evaluate(pbrt::Point2<float>const&)const::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                             *)&f,(Point2f *)&local_d8);
      testing::internal::CmpHelperEQ<int,float>
                ((internal *)&gtest_ar,"0","f.Evaluate(Point2f(r.x + 1e-3, 0))",(int *)&local_c8,
                 &local_cc);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_d8);
        pcVar12 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/filters_test.cpp"
                   ,0x35,pcVar12);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_d8);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_c8.data_._0_4_ = 0;
      local_d8._0_4_ = r.super_Tuple2<pbrt::Vector2,_float>.x + 0.001;
      local_d8._4_4_ = r.super_Tuple2<pbrt::Vector2,_float>.y;
      local_cc = pbrt::
                 TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                 ::
                 Dispatch<pbrt::FilterHandle::Evaluate(pbrt::Point2<float>const&)const::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                             *)&f,(Point2f *)&local_d8);
      testing::internal::CmpHelperEQ<int,float>
                ((internal *)&gtest_ar,"0","f.Evaluate(Point2f(r.x + 1e-3, r.y))",(int *)&local_c8,
                 &local_cc);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_d8);
        pcVar12 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/filters_test.cpp"
                   ,0x36,pcVar12);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_d8);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_c8.data_._0_4_ = 0;
      auVar5._8_4_ = 0x80000000;
      auVar5._0_8_ = 0x8000000080000000;
      auVar5._12_4_ = 0x80000000;
      auVar13 = vxorps_avx512vl(ZEXT416((uint)r.super_Tuple2<pbrt::Vector2,_float>.y),auVar5);
      local_d8._0_4_ = r.super_Tuple2<pbrt::Vector2,_float>.x + 0.001;
      local_d8._4_4_ = auVar13._0_4_;
      local_cc = pbrt::
                 TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                 ::
                 Dispatch<pbrt::FilterHandle::Evaluate(pbrt::Point2<float>const&)const::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                             *)&f,(Point2f *)&local_d8);
      testing::internal::CmpHelperEQ<int,float>
                ((internal *)&gtest_ar,"0","f.Evaluate(Point2f(r.x + 1e-3, -r.y))",(int *)&local_c8,
                 &local_cc);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_d8);
        pcVar12 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/filters_test.cpp"
                   ,0x37,pcVar12);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_d8);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_c8.data_._0_4_ = 0;
      local_d8._0_4_ = -0.001 - r.super_Tuple2<pbrt::Vector2,_float>.x;
      local_d8._4_4_ = 0.0;
      local_cc = pbrt::
                 TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                 ::
                 Dispatch<pbrt::FilterHandle::Evaluate(pbrt::Point2<float>const&)const::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                             *)&f,(Point2f *)&local_d8);
      testing::internal::CmpHelperEQ<int,float>
                ((internal *)&gtest_ar,"0","f.Evaluate(Point2f(-r.x - 1e-3, 0))",(int *)&local_c8,
                 &local_cc);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_d8);
        pcVar12 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/filters_test.cpp"
                   ,0x38,pcVar12);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_d8);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_c8.data_._0_4_ = 0;
      local_d8._0_4_ = -0.001 - r.super_Tuple2<pbrt::Vector2,_float>.x;
      local_d8._4_4_ = r.super_Tuple2<pbrt::Vector2,_float>.y;
      local_cc = pbrt::
                 TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                 ::
                 Dispatch<pbrt::FilterHandle::Evaluate(pbrt::Point2<float>const&)const::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                             *)&f,(Point2f *)&local_d8);
      testing::internal::CmpHelperEQ<int,float>
                ((internal *)&gtest_ar,"0","f.Evaluate(Point2f(-r.x - 1e-3, r.y))",(int *)&local_c8,
                 &local_cc);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_d8);
        pcVar12 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/filters_test.cpp"
                   ,0x39,pcVar12);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_d8);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_c8.data_._0_4_ = 0;
      local_d8._0_4_ = -0.001 - r.super_Tuple2<pbrt::Vector2,_float>.x;
      auVar6._8_4_ = 0x80000000;
      auVar6._0_8_ = 0x8000000080000000;
      auVar6._12_4_ = 0x80000000;
      auVar13 = vxorps_avx512vl(ZEXT416((uint)r.super_Tuple2<pbrt::Vector2,_float>.y),auVar6);
      local_d8._4_4_ = auVar13._0_4_;
      local_cc = pbrt::
                 TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                 ::
                 Dispatch<pbrt::FilterHandle::Evaluate(pbrt::Point2<float>const&)const::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                             *)&f,(Point2f *)&local_d8);
      testing::internal::CmpHelperEQ<int,float>
                ((internal *)&gtest_ar,"0","f.Evaluate(Point2f(-r.x - 1e-3, -r.y))",(int *)&local_c8
                 ,&local_cc);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_d8);
        pcVar12 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar12 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/filters_test.cpp"
                   ,0x3a,pcVar12);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_d8);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
    std::_Vector_base<pbrt::FilterHandle,_std::allocator<pbrt::FilterHandle>_>::~_Vector_base
              (&local_70);
  }
  return;
}

Assistant:

TEST(Filter, Integral) {
    auto approxEqual = [](Float a, Float b) {
        if (std::max(std::abs(a), std::abs(b)) < 1e-3)
            return std::abs(a - b) < 1e-5;
        else
            return 2 * std::abs(a - b) / std::abs(a + b) < 1e-2;
    };
    auto makeFilters = [](const Vector2f &radius) -> std::vector<FilterHandle> {
        return {new BoxFilter(radius), new GaussianFilter(radius),
                new MitchellFilter(radius), new LanczosSincFilter(radius),
                new TriangleFilter(radius)};
    };

    for (FilterHandle f : makeFilters(Vector2f(1, 1)))
        EXPECT_TRUE(approxEqual(f.Integral(), integrateFilter(f))) << f;

    for (FilterHandle f : makeFilters(Vector2f(2.5, 1)))
        EXPECT_TRUE(approxEqual(f.Integral(), integrateFilter(f))) << f;

    for (FilterHandle f : makeFilters(Vector2f(1, 2.5)))
        EXPECT_TRUE(approxEqual(f.Integral(), integrateFilter(f))) << f;

    for (FilterHandle f : makeFilters(Vector2f(3.4, 2.5)))
        EXPECT_TRUE(approxEqual(f.Integral(), integrateFilter(f))) << f;
}